

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts5StorageGetStmt(Fts5Storage *p,int eStmt,sqlite3_stmt **ppStmt,char **pzErrMsg)

{
  int *piVar1;
  Fts5Config *pFVar2;
  sqlite3_stmt *pStmt;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  long lVar9;
  char *pcVar10;
  ulong uVar11;
  sqlite3_stmt **ppStmt_00;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  long in_FS_OFFSET;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = 0;
  uVar11 = (ulong)(uint)eStmt;
  ppStmt_00 = p->aStmt + uVar11;
  iVar12 = 0;
  if (*ppStmt_00 != (sqlite3_stmt *)0x0) goto LAB_001dd1e8;
  pFVar2 = p->pConfig;
  switch(uVar11) {
  case 0:
  case 1:
    pcVar7 = pFVar2->zContentRowid;
    pcVar7 = sqlite3_mprintf((&PTR_anon_var_dwarf_89f69_0023c190)[uVar11],pFVar2->zContentExprlist,
                             pFVar2->zContent,pcVar7,pcVar7,pcVar7);
    break;
  case 2:
  case 3:
    pcVar6 = (&PTR_anon_var_dwarf_89f69_0023c190)[uVar11];
    pcVar7 = pFVar2->zContentExprlist;
    pcVar10 = pFVar2->zContent;
    pcVar8 = pFVar2->zContentRowid;
    goto LAB_001dd0fd;
  case 4:
  case 5:
    uVar13 = 0;
    pcVar6 = (char *)0x0;
    while( true ) {
      lVar9 = (long)pFVar2->nCol;
      bVar4 = lVar9 < (long)uVar13;
      uVar14 = uVar13;
      if (lVar9 < (long)uVar13) break;
      while (((uVar13 = uVar14 + 1, uVar13 != 1 && (pFVar2->eContent != 0)) &&
             (pFVar2->abUnindexed[uVar14 - 1] == '\0'))) {
        bVar4 = lVar9 <= (long)uVar14;
        bVar3 = lVar9 <= (long)uVar14;
        uVar14 = uVar13;
        if (bVar3) goto LAB_001dd00b;
      }
      pcVar7 = ",";
      if (pcVar6 == (char *)0x0) {
        pcVar7 = "";
      }
      pcVar6 = sqlite3Fts5Mprintf(&local_3c,"%z%s?%d",pcVar6,pcVar7,uVar13 & 0xffffffff);
      if (local_3c != 0) break;
    }
LAB_001dd00b:
    if ((pFVar2->bLocale != 0) && (!(bool)(~bVar4 & 1) && pFVar2->eContent == 0)) {
      lVar9 = 0;
      while( true ) {
        iVar12 = pFVar2->nCol;
        if (iVar12 <= lVar9) break;
        while (pFVar2->abUnindexed[lVar9] != '\0') {
          lVar9 = lVar9 + 1;
          if (iVar12 <= lVar9) goto LAB_001dd06f;
        }
        pcVar6 = sqlite3Fts5Mprintf(&local_3c,"%z,?%d",pcVar6,(ulong)(iVar12 + (int)lVar9 + 2));
        lVar9 = lVar9 + 1;
        if (local_3c != 0) break;
      }
    }
LAB_001dd06f:
    pcVar7 = sqlite3Fts5Mprintf(&local_3c,(&PTR_anon_var_dwarf_89f69_0023c190)[uVar11],pFVar2->zDb,
                                pFVar2->zName);
    sqlite3_free(pcVar6);
    break;
  default:
    pcVar7 = (&PTR_anon_var_dwarf_89f69_0023c190)[uVar11];
    pcVar6 = pFVar2->zDb;
    pcVar10 = pFVar2->zName;
    goto LAB_001dd12e;
  case 7:
    pcVar6 = (&PTR_anon_var_dwarf_89f69_0023c190)[uVar11];
    pcVar7 = pFVar2->zDb;
    pcVar10 = pFVar2->zName;
    pcVar8 = ",?";
    if (pFVar2->bContentlessDelete == 0) {
      pcVar8 = "";
    }
    goto LAB_001dd0fd;
  case 9:
    pcVar6 = (&PTR_anon_var_dwarf_89f69_0023c190)[uVar11];
    pcVar7 = ",origin";
    if (pFVar2->bContentlessDelete == 0) {
      pcVar7 = "";
    }
    pcVar10 = pFVar2->zDb;
    pcVar8 = pFVar2->zName;
LAB_001dd0fd:
    pcVar7 = sqlite3_mprintf(pcVar6,pcVar7,pcVar10,pcVar8);
    break;
  case 0xb:
    pcVar7 = (&PTR_anon_var_dwarf_89f69_0023c190)[uVar11];
    pcVar10 = pFVar2->zContent;
    pcVar6 = pFVar2->zContentExprlist;
LAB_001dd12e:
    pcVar7 = sqlite3_mprintf(pcVar7,pcVar6,pcVar10);
  }
  if (pcVar7 == (char *)0x0) {
    iVar12 = 7;
  }
  else {
    piVar1 = &p->pConfig->bLock;
    *piVar1 = *piVar1 + 1;
    iVar5 = sqlite3LockAndPrepare
                      (pFVar2->db,pcVar7,-1,(uint)(3 < eStmt) * 4 + 0x81,(Vdbe *)0x0,ppStmt_00,
                       (char **)0x0);
    piVar1 = &p->pConfig->bLock;
    *piVar1 = *piVar1 + -1;
    sqlite3_free(pcVar7);
    if ((pzErrMsg != (char **)0x0) && (iVar5 != 0)) {
      pcVar7 = sqlite3_errmsg(pFVar2->db);
      pcVar7 = sqlite3_mprintf("%s",pcVar7);
      *pzErrMsg = pcVar7;
    }
    iVar12 = 0xb;
    if (iVar5 != 1) {
      iVar12 = iVar5;
    }
    if (6 < eStmt - 4U) {
      iVar12 = iVar5;
    }
  }
LAB_001dd1e8:
  pStmt = *ppStmt_00;
  *ppStmt = pStmt;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    sqlite3_reset(pStmt);
    return iVar12;
  }
  __stack_chk_fail();
}

Assistant:

static int fts5StorageGetStmt(
  Fts5Storage *p,                 /* Storage handle */
  int eStmt,                      /* FTS5_STMT_XXX constant */
  sqlite3_stmt **ppStmt,          /* OUT: Prepared statement handle */
  char **pzErrMsg                 /* OUT: Error message (if any) */
){
  int rc = SQLITE_OK;

  /* If there is no %_docsize table, there should be no requests for
  ** statements to operate on it.  */
  assert( p->pConfig->bColumnsize || (
        eStmt!=FTS5_STMT_REPLACE_DOCSIZE
     && eStmt!=FTS5_STMT_DELETE_DOCSIZE
     && eStmt!=FTS5_STMT_LOOKUP_DOCSIZE
  ));

  assert( eStmt>=0 && eStmt<ArraySize(p->aStmt) );
  if( p->aStmt[eStmt]==0 ){
    const char *azStmt[] = {
      "SELECT %s FROM %s T WHERE T.%Q >= ? AND T.%Q <= ? ORDER BY T.%Q ASC",
      "SELECT %s FROM %s T WHERE T.%Q <= ? AND T.%Q >= ? ORDER BY T.%Q DESC",
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP  */
      "SELECT %s FROM %s T WHERE T.%Q=?",               /* LOOKUP2  */

      "INSERT INTO %Q.'%q_content' VALUES(%s)",         /* INSERT_CONTENT  */
      "REPLACE INTO %Q.'%q_content' VALUES(%s)",        /* REPLACE_CONTENT */
      "DELETE FROM %Q.'%q_content' WHERE id=?",         /* DELETE_CONTENT  */
      "REPLACE INTO %Q.'%q_docsize' VALUES(?,?%s)",     /* REPLACE_DOCSIZE  */
      "DELETE FROM %Q.'%q_docsize' WHERE id=?",         /* DELETE_DOCSIZE  */

      "SELECT sz%s FROM %Q.'%q_docsize' WHERE id=?",    /* LOOKUP_DOCSIZE  */

      "REPLACE INTO %Q.'%q_config' VALUES(?,?)",        /* REPLACE_CONFIG */
      "SELECT %s FROM %s AS T",                         /* SCAN */
    };
    Fts5Config *pC = p->pConfig;
    char *zSql = 0;

    assert( ArraySize(azStmt)==ArraySize(p->aStmt) );

    switch( eStmt ){
      case FTS5_STMT_SCAN:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent
        );
        break;

      case FTS5_STMT_SCAN_ASC:
      case FTS5_STMT_SCAN_DESC:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zContentExprlist,
            pC->zContent, pC->zContentRowid, pC->zContentRowid,
            pC->zContentRowid
        );
        break;

      case FTS5_STMT_LOOKUP:
      case FTS5_STMT_LOOKUP2:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            pC->zContentExprlist, pC->zContent, pC->zContentRowid
        );
        break;

      case FTS5_STMT_INSERT_CONTENT:
      case FTS5_STMT_REPLACE_CONTENT: {
        char *zBind = 0;
        int i;

        assert( pC->eContent==FTS5_CONTENT_NORMAL
             || pC->eContent==FTS5_CONTENT_UNINDEXED
        );

        /* Add bindings for the "c*" columns - those that store the actual
        ** table content. If eContent==NORMAL, then there is one binding
        ** for each column. Or, if eContent==UNINDEXED, then there are only
        ** bindings for the UNINDEXED columns. */
        for(i=0; rc==SQLITE_OK && i<(pC->nCol+1); i++){
          if( !i || pC->eContent==FTS5_CONTENT_NORMAL || pC->abUnindexed[i-1] ){
            zBind = sqlite3Fts5Mprintf(&rc, "%z%s?%d", zBind, zBind?",":"",i+1);
          }
        }

        /* Add bindings for any "l*" columns. Only non-UNINDEXED columns
        ** require these.  */
        if( pC->bLocale && pC->eContent==FTS5_CONTENT_NORMAL ){
          for(i=0; rc==SQLITE_OK && i<pC->nCol; i++){
            if( pC->abUnindexed[i]==0 ){
              zBind = sqlite3Fts5Mprintf(&rc, "%z,?%d", zBind, pC->nCol+i+2);
            }
          }
        }

        zSql = sqlite3Fts5Mprintf(&rc, azStmt[eStmt], pC->zDb, pC->zName,zBind);
        sqlite3_free(zBind);
        break;
      }

      case FTS5_STMT_REPLACE_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName,
          (pC->bContentlessDelete ? ",?" : "")
        );
        break;

      case FTS5_STMT_LOOKUP_DOCSIZE:
        zSql = sqlite3_mprintf(azStmt[eStmt],
            (pC->bContentlessDelete ? ",origin" : ""),
            pC->zDb, pC->zName
        );
        break;

      default:
        zSql = sqlite3_mprintf(azStmt[eStmt], pC->zDb, pC->zName);
        break;
    }

    if( zSql==0 ){
      rc = SQLITE_NOMEM;
    }else{
      int f = SQLITE_PREPARE_PERSISTENT;
      if( eStmt>FTS5_STMT_LOOKUP2 ) f |= SQLITE_PREPARE_NO_VTAB;
      p->pConfig->bLock++;
      rc = sqlite3_prepare_v3(pC->db, zSql, -1, f, &p->aStmt[eStmt], 0);
      p->pConfig->bLock--;
      sqlite3_free(zSql);
      if( rc!=SQLITE_OK && pzErrMsg ){
        *pzErrMsg = sqlite3_mprintf("%s", sqlite3_errmsg(pC->db));
      }
      if( rc==SQLITE_ERROR && eStmt>FTS5_STMT_LOOKUP2 && eStmt<FTS5_STMT_SCAN ){
        /* One of the internal tables - not the %_content table - is missing.
        ** This counts as a corrupted table.  */
       rc = SQLITE_CORRUPT;
      }
    }
  }

  *ppStmt = p->aStmt[eStmt];
  sqlite3_reset(*ppStmt);
  return rc;
}